

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_a79145::GetList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *var,cmMakefile *makefile)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  PolicyID id;
  PolicyID id_00;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string listString;
  string warn;
  char *local_d0;
  size_t local_c8;
  char local_c0;
  undefined7 uStack_bf;
  string local_b0;
  undefined1 local_90 [32];
  size_t local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = '\0';
  cVar4 = cmMakefile::GetDefinition(makefile,var);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
    bVar6 = true;
    if (local_c8 == 0) goto LAB_0029f0aa;
    arg._M_str = local_d0;
    arg._M_len = local_c8;
    cmExpandList(arg,list,true);
    pcVar1 = local_90 + 0x10;
    local_90._8_8_ = (pointer)0x0;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    local_90._0_8_ = pcVar1;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((list->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (list->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,local_90);
    pbVar2 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((pointer)local_90._0_8_ != pcVar1) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    if (_Var5._M_current == pbVar2) goto LAB_0029f0aa;
    PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0007,false);
    if (1 < PVar3 - REQUIRED_IF_USED) {
      if (PVar3 == OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(list,(list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
        arg_01._M_str = local_d0;
        arg_01._M_len = local_c8;
        cmExpandList(arg_01,list,false);
      }
      else if (PVar3 == WARN) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(list,(list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
        arg_00._M_str = local_d0;
        arg_00._M_len = local_c8;
        cmExpandList(arg_00,list,false);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b0,(cmPolicies *)0x7,id_00);
        local_90._0_8_ = local_b0._M_string_length;
        local_90._8_8_ = local_b0._M_dataplus._M_p;
        local_90._16_8_ = 0x13;
        local_90._24_8_ = " List has value = [";
        local_70 = local_c8;
        local_68 = local_d0;
        local_60 = 2;
        local_58 = "].";
        views._M_len = 4;
        views._M_array = (iterator)local_90;
        cmCatViews_abi_cxx11_(&local_50,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::IssueMessage(makefile,AUTHOR_WARNING,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0029f0aa;
    }
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_90,(cmPolicies *)0x7,id);
    cmMakefile::IssueMessage(makefile,FATAL_ERROR,(string *)local_90);
    if ((pointer)local_90._0_8_ != pcVar1) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  bVar6 = false;
LAB_0029f0aa:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return bVar6;
}

Assistant:

bool GetList(std::vector<std::string>& list, const std::string& var,
             const cmMakefile& makefile)
{
  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return false;
  }
  // if the size of the list
  if (listString.empty()) {
    return true;
  }
  // expand the variable into a list
  cmExpandList(listString, list, true);
  // if no empty elements then just return
  if (!cm::contains(list, std::string())) {
    return true;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return true;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      return true;
    case cmPolicies::NEW:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return false;
  }
  return true;
}